

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_iarchive_impl.cpp
# Opt level: O1

void __thiscall
boost::archive::json_iarchive_impl::load_override(json_iarchive_impl *this,object_reference_type *t)

{
  base_type bVar1;
  undefined8 in_RAX;
  Json *this_00;
  reference j;
  uint local_24 [2];
  uint ret;
  
  local_24[0] = (uint)((ulong)in_RAX >> 0x20);
  this_00 = json_archive::get_data_abi_cxx11_(&(this->super_json_archive_interface).archive_);
  j = nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::operator[](this_00,(key_type *)param::ObjectReferenceType_abi_cxx11_);
  if ((byte)(j->m_type - number_integer) < 3) {
    nlohmann::detail::
    from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_unsigned_int,_0>
              (j,local_24);
    (this->super_json_archive_interface).object_id_.super_type.m_storage = local_24[0];
    (this->super_json_archive_interface).object_id_.super_type.m_initialized = true;
    (this->super_json_archive_interface).object_id_type_ = Reference;
    if ((this->super_json_archive_interface).class_id_.super_type.m_initialized == false) {
      __assert_fail("this->is_initialized()","/usr/include/boost/optional/optional.hpp",0x4bc,
                    "reference_type boost::optional<unsigned int>::get() [T = unsigned int]");
    }
    bVar1 = (this->super_json_archive_interface).class_id_.super_type.m_storage;
    if ((int)bVar1 < 0) {
      __assert_fail("t_ <= boost::integer_traits<base_type>::const_max",
                    "/usr/include/boost/archive/basic_archive.hpp",0x7d,
                    "boost::archive::object_id_type::object_id_type(const std::size_t &)");
    }
    (t->super_object_id_type).t = bVar1;
  }
  return;
}

Assistant:

void json_iarchive_impl::load_override(object_reference_type& t)
{
    Json& data = archive_.get_data()[param::ObjectReferenceType];
    if(!data.is_number())
    {
        return;
    }

    object_id_ = data;
    object_id_type_ = ObjectIDType::Reference;
    t = object_reference_type(object_id_type(int(*class_id_)));
}